

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O2

bool __thiscall xmrig::Httpd::start(Httpd *this)

{
  ushort uVar1;
  char *pcVar2;
  uint uVar3;
  Config *pCVar4;
  HttpServer *this_00;
  TcpServer *this_01;
  undefined8 uVar5;
  sockaddr *__addr;
  bool bVar6;
  String *pSVar7;
  String *host;
  
  pCVar4 = Base::config(this->m_base);
  bVar6 = true;
  if ((pCVar4->super_BaseConfig).m_http.m_enabled == true) {
    this_00 = (HttpServer *)operator_new(0x10);
    HttpServer::HttpServer(this_00,&this->super_IHttpListener);
    this->m_http = this_00;
    this_01 = (TcpServer *)operator_new(0xa8);
    host = &(pCVar4->super_BaseConfig).m_http.m_host;
    pSVar7 = host;
    TcpServer::TcpServer
              (this_01,host,(pCVar4->super_BaseConfig).m_http.m_port,(ITcpServerListener *)this_00);
    this->m_server = this_01;
    uVar3 = TcpServer::bind(this_01,(int)pSVar7,__addr,(socklen_t)this_00);
    pcVar2 = host->m_data;
    if ((int)uVar3 < 0) {
      uVar1 = (pCVar4->super_BaseConfig).m_http.m_port;
      uVar5 = uv_strerror(uVar3);
      bVar6 = false;
      Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;34m%s:%d\x1b[0m \x1b[1;31m%s\x1b[0m"
                 ,"HTTP API",pcVar2,(ulong)uVar1,uVar5);
      stop(this);
    }
    else {
      Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;34m%s:%d\x1b[0m \x1b[1;31m%s\x1b[0m"
                 ,"HTTP API",pcVar2,(ulong)uVar3,"");
      this->m_port = (uint16_t)uVar3;
    }
  }
  return bVar6;
}

Assistant:

bool xmrig::Httpd::start()
{
    const Http &config = m_base->config()->http();

    if (!config.isEnabled()) {
        return true;
    }

    m_http   = new HttpServer(this);
    m_server = new TcpServer(config.host(), config.port(), m_http);

    const int rc = m_server->bind();
    Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") BLUE_BOLD("%s:%d") " " RED_BOLD("%s"),
               "HTTP API",
               config.host().data(),
               rc < 0 ? config.port() : rc,
               rc < 0 ? uv_strerror(rc) : ""
               );

    if (rc < 0) {
        stop();

        return false;
    }

    m_port = static_cast<uint16_t>(rc);

#   ifdef _WIN32
    HRSRC src = FindResource(nullptr, MAKEINTRESOURCE(1), RT_ICON);
    if (src != nullptr) {
        HGLOBAL res = LoadResource(nullptr, src);
        if (res != nullptr) {
            favicon     = static_cast<const char *>(LockResource(res));
            faviconSize = SizeofResource(nullptr, src);
        }
    }
#   endif

    return true;
}